

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

bool __thiscall
tetgenio::load_node_call(tetgenio *this,FILE *infile,int markers,int uvflag,char *infilename)

{
  undefined1 auVar1 [16];
  int iVar2;
  double *pdVar3;
  int *piVar4;
  pointparam *ppVar5;
  tetgenio *ptVar6;
  long lVar7;
  tetgenio *this_00;
  undefined4 in_register_0000000c;
  pointparam *infilename_00;
  int iVar8;
  long lVar9;
  char *__format;
  ulong uVar10;
  long lVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  char *stringptr;
  int local_858;
  int local_854;
  double local_850;
  FILE *local_848;
  double local_840;
  char inputline [2048];
  
  infilename_00 = (pointparam *)CONCAT44(in_register_0000000c,uvflag);
  iVar8 = this->numberofpoints;
  uVar10 = (ulong)iVar8;
  ptVar6 = (tetgenio *)0xffffffffffffffff;
  this_00 = (tetgenio *)(uVar10 * 0x18);
  if ((long)uVar10 < 0) {
    this_00 = ptVar6;
  }
  local_858 = markers;
  local_854 = uvflag;
  local_848 = infile;
  pdVar3 = (double *)operator_new__((ulong)this_00);
  this->pointlist = pdVar3;
  if (0 < this->numberofpointattributes) {
    iVar2 = this->numberofpointattributes * iVar8;
    this_00 = (tetgenio *)((long)iVar2 * 8);
    if (iVar2 < 0) {
      this_00 = ptVar6;
    }
    pdVar3 = (double *)operator_new__((ulong)this_00);
    this->pointattributelist = pdVar3;
  }
  if (local_858 != 0) {
    this_00 = (tetgenio *)(uVar10 * 4);
    if (iVar8 < 0) {
      this_00 = ptVar6;
    }
    piVar4 = (int *)operator_new__((ulong)this_00);
    this->pointmarkerlist = piVar4;
  }
  if (local_854 != 0) {
    infilename_00 = (pointparam *)0x18;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar10;
    this_00 = ptVar6;
    if (SUB168(auVar1 * ZEXT816(0x18),8) == 0) {
      this_00 = SUB168(auVar1 * ZEXT816(0x18),0);
    }
    ppVar5 = (pointparam *)operator_new__((ulong)this_00);
    this->pointparamlist = ppVar5;
  }
  lVar9 = 0;
  lVar11 = 0;
  lVar12 = 0;
  do {
    iVar8 = (int)lVar9;
    if ((int)uVar10 <= lVar9) {
LAB_0010d8d6:
      iVar2 = this->numberofpoints;
      if (iVar8 < iVar2) {
        if (this->pointlist != (double *)0x0) {
          operator_delete__(this->pointlist);
        }
        this->pointlist = (double *)0x0;
        if (local_858 != 0) {
          if (this->pointmarkerlist != (int *)0x0) {
            operator_delete__(this->pointmarkerlist);
          }
          this->pointmarkerlist = (int *)0x0;
        }
        if (0 < this->numberofpointattributes) {
          if (this->pointattributelist != (double *)0x0) {
            operator_delete__(this->pointattributelist);
          }
          this->pointattributelist = (double *)0x0;
        }
        if (local_854 != 0) {
          if (this->pointparamlist != (pointparam *)0x0) {
            operator_delete__(this->pointparamlist);
          }
          this->pointparamlist = (pointparam *)0x0;
        }
        this->numberofpoints = 0;
      }
      return iVar2 <= iVar8;
    }
    ptVar6 = (tetgenio *)readnumberline(this_00,inputline,local_848,(char *)infilename_00);
    if (this->useindex != 0) {
      stringptr = (char *)ptVar6;
      if (lVar9 == 0) {
        lVar7 = strtol((char *)ptVar6,&stringptr,0);
        this_00 = ptVar6;
        if ((uint)lVar7 < 2) {
          this->firstnumber = (uint)lVar7;
        }
      }
      ptVar6 = (tetgenio *)findnextnumber(this_00,stringptr);
    }
    stringptr = (char *)ptVar6;
    if ((char)ptVar6->firstnumber == '\0') {
      uVar10 = (ulong)(uint)(this->firstnumber + iVar8);
      __format = "Error:  Point %d has no x coordinate.\n";
LAB_0010d8cf:
      printf(__format,uVar10);
      goto LAB_0010d8d6;
    }
    local_840 = strtod((char *)ptVar6,&stringptr);
    this_00 = (tetgenio *)findnextnumber(ptVar6,stringptr);
    stringptr = (char *)this_00;
    if ((char)this_00->firstnumber == '\0') {
      uVar10 = (ulong)(uint)(this->firstnumber + iVar8);
      __format = "Error:  Point %d has no y coordinate.\n";
      goto LAB_0010d8cf;
    }
    dVar13 = strtod((char *)this_00,&stringptr);
    dVar14 = 0.0;
    if (this->mesh_dim == 3) {
      local_850 = dVar13;
      this_00 = (tetgenio *)findnextnumber(this_00,stringptr);
      stringptr = (char *)this_00;
      if ((char)this_00->firstnumber == '\0') {
        uVar10 = (ulong)(uint)(this->firstnumber + iVar8);
        __format = "Error:  Point %d has no z coordinate.\n";
        goto LAB_0010d8cf;
      }
      dVar14 = strtod((char *)this_00,&stringptr);
      dVar13 = local_850;
    }
    pdVar3 = this->pointlist;
    pdVar3[lVar11] = local_840;
    pdVar3[lVar11 + 1] = dVar13;
    pdVar3[lVar11 + 2] = dVar14;
    lVar12 = (long)(int)lVar12;
    for (iVar2 = 0; iVar2 < this->numberofpointattributes; iVar2 = iVar2 + 1) {
      ptVar6 = (tetgenio *)findnextnumber(this_00,stringptr);
      stringptr = (char *)ptVar6;
      if ((char)ptVar6->firstnumber == '\0') {
        dVar13 = 0.0;
      }
      else {
        dVar13 = strtod((char *)ptVar6,&stringptr);
        this_00 = ptVar6;
      }
      this->pointattributelist[lVar12] = dVar13;
      lVar12 = lVar12 + 1;
    }
    if (local_858 != 0) {
      ptVar6 = (tetgenio *)findnextnumber(this_00,stringptr);
      stringptr = (char *)ptVar6;
      if ((char)ptVar6->firstnumber == '\0') {
        iVar2 = 0;
      }
      else {
        lVar7 = strtol((char *)ptVar6,&stringptr,0);
        iVar2 = (int)lVar7;
        this_00 = ptVar6;
      }
      infilename_00 = (pointparam *)this->pointmarkerlist;
      *(int *)((long)infilename_00->uv + lVar9 * 4) = iVar2;
    }
    if (local_854 != 0) {
      ptVar6 = (tetgenio *)findnextnumber(this_00,stringptr);
      stringptr = (char *)ptVar6;
      if ((char)ptVar6->firstnumber == '\0') {
        uVar10 = (ulong)(uint)(this->firstnumber + iVar8);
        __format = "Error:  Point %d has no uv[0].\n";
      }
      else {
        dVar13 = strtod((char *)ptVar6,&stringptr);
        this->pointparamlist[lVar9].uv[0] = dVar13;
        ptVar6 = (tetgenio *)findnextnumber(ptVar6,stringptr);
        stringptr = (char *)ptVar6;
        if ((char)ptVar6->firstnumber == '\0') {
          uVar10 = (ulong)(uint)(this->firstnumber + iVar8);
          __format = "Error:  Point %d has no uv[1].\n";
        }
        else {
          dVar13 = strtod((char *)ptVar6,&stringptr);
          this->pointparamlist[lVar9].uv[1] = dVar13;
          ptVar6 = (tetgenio *)findnextnumber(ptVar6,stringptr);
          stringptr = (char *)ptVar6;
          if ((char)ptVar6->firstnumber == '\0') {
            uVar10 = (ulong)(uint)(this->firstnumber + iVar8);
            __format = "Error:  Point %d has no tag.\n";
          }
          else {
            lVar7 = strtol((char *)ptVar6,&stringptr,0);
            this->pointparamlist[lVar9].tag = (int)lVar7;
            this_00 = (tetgenio *)findnextnumber(ptVar6,stringptr);
            stringptr = (char *)this_00;
            if ((char)this_00->firstnumber == '\0') {
              uVar10 = (ulong)(uint)(this->firstnumber + iVar8);
              __format = "Error:  Point %d has no type.\n";
            }
            else {
              lVar7 = strtol((char *)this_00,&stringptr,0);
              infilename_00 = this->pointparamlist;
              infilename_00[lVar9].type = (uint)lVar7;
              if ((uint)lVar7 < 3) goto LAB_0010d859;
              uVar10 = (ulong)(uint)(this->firstnumber + iVar8);
              __format = "Error:  Point %d has an invalid type.\n";
            }
          }
        }
      }
      goto LAB_0010d8cf;
    }
LAB_0010d859:
    lVar11 = lVar11 + 3;
    lVar9 = lVar9 + 1;
    uVar10 = (ulong)(uint)this->numberofpoints;
  } while( true );
}

Assistant:

bool tetgenio::load_node_call(FILE* infile, int markers, int uvflag, 
                              char* infilename)
{
  char inputline[INPUTLINESIZE];
  char *stringptr;
  REAL x, y, z, attrib;
  int firstnode, currentmarker;
  int index, attribindex;
  int i, j;

  // Initialize 'pointlist', 'pointattributelist', and 'pointmarkerlist'.
  pointlist = new REAL[numberofpoints * 3];
  if (pointlist == (REAL *) NULL) {
    terminatetetgen(NULL, 1);
  }
  if (numberofpointattributes > 0) {
    pointattributelist = new REAL[numberofpoints * numberofpointattributes];
    if (pointattributelist == (REAL *) NULL) {
      terminatetetgen(NULL, 1);
    }
  }
  if (markers) {
    pointmarkerlist = new int[numberofpoints];
    if (pointmarkerlist == (int *) NULL) {
      terminatetetgen(NULL, 1);
    }
  }
  if (uvflag) {
    pointparamlist = new pointparam[numberofpoints];
    if (pointparamlist == NULL) {
      terminatetetgen(NULL, 1);
    }
  }

  // Read the point section.
  index = 0;
  attribindex = 0;
  for (i = 0; i < numberofpoints; i++) {
    stringptr = readnumberline(inputline, infile, infilename);
    if (useindex) {
      if (i == 0) {
        firstnode = (int) strtol (stringptr, &stringptr, 0);
        if ((firstnode == 0) || (firstnode == 1)) {
          firstnumber = firstnode;
        }
      }
      stringptr = findnextnumber(stringptr);
    } // if (useindex)
    if (*stringptr == '\0') {
      printf("Error:  Point %d has no x coordinate.\n", firstnumber + i);
      break;
    }
    x = (REAL) strtod(stringptr, &stringptr);
    stringptr = findnextnumber(stringptr);
    if (*stringptr == '\0') {
      printf("Error:  Point %d has no y coordinate.\n", firstnumber + i);
      break;
    }
    y = (REAL) strtod(stringptr, &stringptr);
    if (mesh_dim == 3) {
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        printf("Error:  Point %d has no z coordinate.\n", firstnumber + i);
        break;
      }
      z = (REAL) strtod(stringptr, &stringptr);
    } else {
      z = 0.0; // mesh_dim == 2;
    }
    pointlist[index++] = x;
    pointlist[index++] = y;
    pointlist[index++] = z;
    // Read the point attributes.
    for (j = 0; j < numberofpointattributes; j++) {
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        attrib = 0.0;
      } else {
        attrib = (REAL) strtod(stringptr, &stringptr);
      }
      pointattributelist[attribindex++] = attrib;
    }
    if (markers) {
      // Read a point marker.
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        currentmarker = 0;
      } else {
        currentmarker = (int) strtol (stringptr, &stringptr, 0);
      }
      pointmarkerlist[i] = currentmarker;
    }
    if (uvflag) {
      // Read point paramteters.
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        printf("Error:  Point %d has no uv[0].\n", firstnumber + i);
        break;
      }
      pointparamlist[i].uv[0] = (REAL) strtod(stringptr, &stringptr);
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        printf("Error:  Point %d has no uv[1].\n", firstnumber + i);
        break;
      }
      pointparamlist[i].uv[1] = (REAL) strtod(stringptr, &stringptr);
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        printf("Error:  Point %d has no tag.\n", firstnumber + i);
        break;
      }
      pointparamlist[i].tag = (int) strtol (stringptr, &stringptr, 0);
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        printf("Error:  Point %d has no type.\n", firstnumber + i);
        break;
      }
      pointparamlist[i].type = (int) strtol (stringptr, &stringptr, 0);
      if ((pointparamlist[i].type < 0) || (pointparamlist[i].type > 2)) {
        printf("Error:  Point %d has an invalid type.\n", firstnumber + i);
        break;
      }
    }
  }
  if (i < numberofpoints) {
    // Failed to read points due to some error.
    delete [] pointlist;
    pointlist = (REAL *) NULL;
    if (markers) {
      delete [] pointmarkerlist;
      pointmarkerlist = (int *) NULL;
    }
    if (numberofpointattributes > 0) {
      delete [] pointattributelist;
      pointattributelist = (REAL *) NULL;
    }
    if (uvflag) {
      delete [] pointparamlist;
      pointparamlist = NULL;
    }
    numberofpoints = 0;
    return false;
  }
  return true;
}